

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O0

float ncnn::get_value_bounded(Mat *image,int x,int y,int z,int padding_mode,int align_corner)

{
  int in_R9D;
  float fVar1;
  int in_stack_0000004c;
  int in_stack_00000050;
  int in_stack_00000054;
  Mat *in_stack_00000058;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  
  compute_coord(in_R9D,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
               );
  compute_coord(in_R9D,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
               );
  compute_coord(in_R9D,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
               );
  fVar1 = get_value_bounded(in_stack_00000058,in_stack_00000054,in_stack_00000050,in_stack_0000004c)
  ;
  return fVar1;
}

Assistant:

static float get_value_bounded(const Mat& image, int x, int y, int z, int padding_mode, int align_corner)
{
    x = compute_coord(x, image.w, padding_mode, align_corner);
    y = compute_coord(y, image.h, padding_mode, align_corner);
    z = compute_coord(z, image.c, padding_mode, align_corner);

    return get_value_bounded(image, x, y, z);
}